

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImVec2 IVar1;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 pos;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) ||
        (id = GImGui->ActiveIdWindow->MoveId, id != GImGui->ActiveId)) ||
       (KeepAliveID(id), (pIVar2->IO).MouseDown[0] != false)) {
      return;
    }
  }
  else {
    KeepAliveID(GImGui->ActiveId);
    if ((pIVar2->MovingWindow == (ImGuiWindow *)0x0) ||
       (window = pIVar2->MovingWindow->RootWindow, window == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0xf25,"void ImGui::UpdateMouseMovingWindowNewFrame()");
    }
    if (((pIVar2->IO).MouseDown[0] == true) &&
       (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos), bVar3)) {
      IVar1 = (pIVar2->IO).MousePos;
      pos.x = IVar1.x - (pIVar2->ActiveIdClickOffset).x;
      pos.y = IVar1.y - (pIVar2->ActiveIdClickOffset).y;
      SetWindowPos(window,&pos,1);
      FocusWindow(pIVar2->MovingWindow);
      return;
    }
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
  }
  ClearActiveID();
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            SetWindowPos(moving_window, pos, ImGuiCond_Always);
            FocusWindow(g.MovingWindow);
        }
        else
        {
            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}